

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void Console::Dbg(char *f,...)

{
  FILE *__stream;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char local_f8 [8];
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  __stream = _stdout;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (Styled == '\x01') {
    builtin_strncpy(local_f8,"\x1b[37m",6);
    local_f8[6] = 'm';
    local_f8[7] = '\0';
    fputs(local_f8,_stdout);
  }
  print_timestamp((FILE *)__stream);
  local_e8 = local_d8;
  local_f0 = &args[0].overflow_arg_area;
  local_f8[0] = '\b';
  local_f8[1] = '\0';
  local_f8[2] = '\0';
  local_f8[3] = '\0';
  local_f8[4] = '0';
  local_f8[5] = '\0';
  local_f8[6] = '\0';
  local_f8[7] = '\0';
  fputs("[DBG] ",__stream);
  vfprintf(__stream,f,local_f8);
  fputs("\n",__stream);
  if (Styled == '\x01') {
    fputs("\x1b[0m",_stdout);
  }
  return;
}

Assistant:

void Dbg(const char* f, ...)
{
	CONSOLE_GENERIC_OUT("DBG", STREAM_OUT, COLOR_GREY, false);
}